

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O2

cmFileLockResult __thiscall cmFileLockPool::Release(cmFileLockPool *this,string *filename)

{
  pointer ppSVar1;
  bool bVar2;
  cmFileLockResult cVar3;
  ScopePool **funcScope;
  pointer ppSVar4;
  List *__range1;
  cmFileLockResult result;
  cmFileLockResult local_30;
  
  ppSVar4 = (this->FunctionScopes).
            super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppSVar1 = (this->FunctionScopes).
            super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppSVar4 == ppSVar1) {
      ppSVar4 = (this->FileScopes).
                super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppSVar1 = (this->FileScopes).
                super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      do {
        if (ppSVar4 == ppSVar1) {
          cVar3 = ScopePool::Release(&this->ProcessScope,filename);
          return cVar3;
        }
        local_30 = ScopePool::Release(*ppSVar4,filename);
        bVar2 = cmFileLockResult::IsOk(&local_30);
        ppSVar4 = ppSVar4 + 1;
      } while (bVar2);
      return local_30;
    }
    local_30 = ScopePool::Release(*ppSVar4,filename);
    bVar2 = cmFileLockResult::IsOk(&local_30);
    ppSVar4 = ppSVar4 + 1;
  } while (bVar2);
  return local_30;
}

Assistant:

cmFileLockResult cmFileLockPool::Release(const std::string& filename)
{
  for (auto& funcScope : this->FunctionScopes) {
    const cmFileLockResult result = funcScope->Release(filename);
    if (!result.IsOk()) {
      return result;
    }
  }

  for (auto& fileScope : this->FileScopes) {
    const cmFileLockResult result = fileScope->Release(filename);
    if (!result.IsOk()) {
      return result;
    }
  }

  return this->ProcessScope.Release(filename);
}